

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks_connecter.cpp
# Opt level: O1

int __thiscall zmq::socks_connecter_t::connect_to_proxy(socks_connecter_t *this)

{
  void *pvVar1;
  bool bVar2;
  fd_t fVar3;
  socklen_t sVar4;
  int iVar5;
  tcp_address_t *ptVar6;
  sockaddr *psVar7;
  int *piVar8;
  
  if ((this->super_stream_connecter_base_t)._s != -1) {
    connect_to_proxy();
  }
  pvVar1 = (this->_proxy_addr->resolved).dummy;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,0x3c);
    (this->_proxy_addr->resolved).dummy = (void *)0x0;
  }
  ptVar6 = (tcp_address_t *)operator_new(0x3c,(nothrow_t *)&std::nothrow);
  if (ptVar6 == (tcp_address_t *)0x0) {
    ptVar6 = (tcp_address_t *)0x0;
  }
  else {
    tcp_address_t::tcp_address_t(ptVar6);
  }
  (this->_proxy_addr->resolved).tcp_addr = ptVar6;
  if ((this->_proxy_addr->resolved).dummy == (void *)0x0) {
    connect_to_proxy();
  }
  fVar3 = tcp_open_socket((this->_proxy_addr->address)._M_dataplus._M_p,
                          &(this->super_stream_connecter_base_t).super_own_t.options,false,false,
                          (this->_proxy_addr->resolved).tcp_addr);
  (this->super_stream_connecter_base_t)._s = fVar3;
  pvVar1 = (this->_proxy_addr->resolved).dummy;
  if (fVar3 == -1) {
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,0x3c);
    }
    (this->_proxy_addr->resolved).dummy = (void *)0x0;
LAB_001f5327:
    iVar5 = -1;
  }
  else {
    if (pvVar1 == (void *)0x0) {
      connect_to_proxy();
    }
    unblock_socket((this->super_stream_connecter_base_t)._s);
    ptVar6 = (this->_proxy_addr->resolved).tcp_addr;
    bVar2 = tcp_address_t::has_src_addr(ptVar6);
    if (bVar2) {
      iVar5 = (this->super_stream_connecter_base_t)._s;
      psVar7 = tcp_address_t::src_addr(ptVar6);
      sVar4 = tcp_address_t::src_addrlen(ptVar6);
      iVar5 = bind(iVar5,(sockaddr *)psVar7,sVar4);
      if (iVar5 == -1) {
        stream_connecter_base_t::close(&this->super_stream_connecter_base_t,(int)psVar7);
        goto LAB_001f5327;
      }
    }
    iVar5 = (this->super_stream_connecter_base_t)._s;
    psVar7 = tcp_address_t::addr(ptVar6);
    sVar4 = tcp_address_t::addrlen(ptVar6);
    iVar5 = connect(iVar5,(sockaddr *)psVar7,sVar4);
    if (iVar5 == 0) {
      iVar5 = 0;
    }
    else {
      piVar8 = __errno_location();
      iVar5 = -1;
      if (*piVar8 == 4) {
        *piVar8 = 0x73;
      }
    }
  }
  return iVar5;
}

Assistant:

int zmq::socks_connecter_t::connect_to_proxy ()
{
    zmq_assert (_s == retired_fd);

    //  Resolve the address
    if (_proxy_addr->resolved.tcp_addr != NULL) {
        LIBZMQ_DELETE (_proxy_addr->resolved.tcp_addr);
    }

    _proxy_addr->resolved.tcp_addr = new (std::nothrow) tcp_address_t ();
    alloc_assert (_proxy_addr->resolved.tcp_addr);
    //  Automatic fallback to ipv4 is disabled here since this was the existing
    //  behaviour, however I don't see a real reason for this. Maybe this can
    //  be changed to true (and then the parameter can be removed entirely).
    _s = tcp_open_socket (_proxy_addr->address.c_str (), options, false, false,
                          _proxy_addr->resolved.tcp_addr);
    if (_s == retired_fd) {
        //  TODO we should emit some event in this case!
        LIBZMQ_DELETE (_proxy_addr->resolved.tcp_addr);
        return -1;
    }
    zmq_assert (_proxy_addr->resolved.tcp_addr != NULL);

    // Set the socket to non-blocking mode so that we get async connect().
    unblock_socket (_s);

    const tcp_address_t *const tcp_addr = _proxy_addr->resolved.tcp_addr;

    int rc;

    // Set a source address for conversations
    if (tcp_addr->has_src_addr ()) {
#if defined ZMQ_HAVE_VXWORKS
        rc = ::bind (_s, (sockaddr *) tcp_addr->src_addr (),
                     tcp_addr->src_addrlen ());
#else
        rc = ::bind (_s, tcp_addr->src_addr (), tcp_addr->src_addrlen ());
#endif
        if (rc == -1) {
            close ();
            return -1;
        }
    }

    //  Connect to the remote peer.
#if defined ZMQ_HAVE_VXWORKS
    rc = ::connect (_s, (sockaddr *) tcp_addr->addr (), tcp_addr->addrlen ());
#else
    rc = ::connect (_s, tcp_addr->addr (), tcp_addr->addrlen ());
#endif
    //  Connect was successful immediately.
    if (rc == 0)
        return 0;

        //  Translate error codes indicating asynchronous connect has been
        //  launched to a uniform EINPROGRESS.
#ifdef ZMQ_HAVE_WINDOWS
    const int last_error = WSAGetLastError ();
    if (last_error == WSAEINPROGRESS || last_error == WSAEWOULDBLOCK)
        errno = EINPROGRESS;
    else {
        errno = wsa_error_to_errno (last_error);
        close ();
    }
#else
    if (errno == EINTR)
        errno = EINPROGRESS;
#endif
    return -1;
}